

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

void __thiscall smf::MidiFile::MidiFile(MidiFile *this,MidiFile *other)

{
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ticksPerQuarterNote = 0x78;
  this->m_trackCount = 1;
  this->m_theTrackState = 0;
  this->m_theTimeState = 1;
  (this->m_readFileName)._M_dataplus._M_p = (pointer)&(this->m_readFileName).field_2;
  (this->m_readFileName)._M_string_length = 0;
  (this->m_readFileName).field_2._M_local_buf[0] = '\0';
  this->m_timemapvalid = false;
  (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_rwstatus = true;
  this->m_linkedEventsQ = false;
  operator=(this,other);
  return;
}

Assistant:

MidiFile::MidiFile(const MidiFile& other) {
	*this = other;
}